

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O2

void TPZShapeHCurlNoGrads<pzshape::TPZShapeQuad>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  int iVar1;
  int i;
  long lVar2;
  
  TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize(ids,connectorders,data);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,5);
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    iVar1 = ComputeNConnectShapeF((int)lVar2,connectorders->fStore[lVar2]);
    (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[lVar2] = iVar1;
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                       TPZVec<int> &connectorders,
                                       TPZShapeData &data)
{
  TPZShapeHCurl<TSHAPE>::Initialize(ids,connectorders,data);
  constexpr int ncon = TSHAPE::NSides-TSHAPE::NCornerNodes;
  data.fHDivNumConnectShape.Resize(ncon);
  //we need to update the number of filtered hcurl functions
  for (int i = 0; i < ncon; i++){
    data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,connectorders[i]);
  }
}